

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerHLSL::emit_buffer_block(CompilerHLSL *this,SPIRVariable *var)

{
  ID *__k;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *variables_primary;
  ID *ts;
  size_t sVar1;
  pointer pcVar2;
  uint uVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  SPIRType *type;
  const_iterator cVar7;
  SPIRType *pSVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  iterator iVar11;
  mapped_type *pmVar12;
  string *psVar13;
  CompilerError *this_00;
  runtime_error *prVar14;
  char *pcVar15;
  undefined1 *puVar16;
  string *ts_2;
  TypedID<(spirv_cross::Types)0> *in_R9;
  uint32_t index;
  ulong uVar17;
  long lVar18;
  char *__s;
  __hashtable *__h;
  string type_name;
  string member_name;
  string local_c8;
  uint32_t failed_index_1;
  uint uStack_a4;
  Bitset flags;
  uint32_t failed_index;
  uint uStack_5c;
  char local_50 [16];
  TypedID<(spirv_cross::Types)1> *local_40;
  ID *local_38;
  
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(var->super_IVariant).field_0xc);
  bVar5 = true;
  if (var->storage != StorageClassStorageBuffer) {
    bVar5 = Compiler::has_decoration
                      ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBufferBlock);
  }
  flags.lower._0_4_ = (var->super_IVariant).self.id;
  cVar7 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->super_CompilerGLSL).flattened_buffer_blocks._M_h,(key_type *)&flags);
  if (cVar7.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    ts = &(var->super_IVariant).self;
    if (bVar5 == false) {
      if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
        flags.lower._0_4_ = ts->id;
        pmVar9 = ::std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&(this->super_CompilerGLSL).flattened_structs,(key_type *)&flags);
        *pmVar9 = false;
        __k = &(type->super_IVariant).self;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&flags,this,(ulong)(type->super_IVariant).self.id,0);
        pmVar10 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,__k);
        if ((((pmVar10->decoration).alias._M_string_length == 0) ||
            (iVar11 = ::std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::find(&(this->super_CompilerGLSL).resource_names._M_h,(key_type *)&flags),
            iVar11.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur != (__node_type *)0x0)) ||
           (iVar11 = ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find(&(this->super_CompilerGLSL).block_names._M_h,(key_type *)&flags),
           iVar11.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur != (__node_type *)0x0)) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[4])
                    (&type_name,this,(ulong)ts->id);
          ::std::__cxx11::string::_M_assign((string *)&flags);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)type_name._M_dataplus._M_p != &type_name.field_2) {
            operator_delete(type_name._M_dataplus._M_p);
          }
        }
        variables_primary = &(this->super_CompilerGLSL).block_names;
        CompilerGLSL::add_variable
                  (&this->super_CompilerGLSL,variables_primary,
                   &(this->super_CompilerGLSL).resource_names,(string *)&flags);
        if (flags.higher._M_h._M_buckets == (__buckets_ptr)0x0) {
          pSVar8 = Variant::get<spirv_cross::SPIRType>
                             ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                              super_VectorView<spirv_cross::Variant>.ptr +
                              *(uint *)&(var->super_IVariant).field_0xc);
          join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&>
                    (&type_name,(spirv_cross *)0x2beef5,(char (*) [2])&(pSVar8->super_IVariant).self
                     ,(TypedID<(spirv_cross::Types)0> *)0x2beef5,(char (*) [2])ts,in_R9);
          ::std::__cxx11::string::operator=((string *)&flags,(string *)&type_name);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)type_name._M_dataplus._M_p != &type_name.field_2) {
            operator_delete(type_name._M_dataplus._M_p);
          }
        }
        _failed_index_1 = (char *)((ulong)uStack_a4 << 0x20);
        ts_2 = (string *)0x0;
        bVar5 = CompilerGLSL::buffer_is_packing_standard
                          (&this->super_CompilerGLSL,type,BufferPackingHLSLCbufferPackOffset,
                           &failed_index_1,0,0xffffffff);
        if (!bVar5) {
          prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
          CompilerGLSL::to_member_name_abi_cxx11_
                    (&member_name,&this->super_CompilerGLSL,type,failed_index_1);
          join<char_const(&)[12],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[9],std::__cxx11::string&,char_const(&)[17],unsigned_int&,char_const(&)[9],std::__cxx11::string,char_const(&)[69]>
                    (&type_name,(spirv_cross *)0x2be7cd,(char (*) [12])ts,
                     (TypedID<(spirv_cross::Types)0> *)" (name: ",(char (*) [9])&flags,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "), member index ",(char (*) [17])&failed_index_1,(uint *)" (name: ",
                     (char (*) [9])&member_name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ") cannot be expressed with either HLSL packing layout or packoffset.",
                     (char (*) [69])type_name._M_dataplus._M_p);
          ::std::runtime_error::runtime_error(prVar14,(string *)&type_name);
          *(undefined ***)prVar14 = &PTR__runtime_error_0035bd08;
          __cxa_throw(prVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        Compiler::set_extended_decoration
                  ((Compiler *)this,__k->id,SPIRVCrossDecorationExplicitOffset,0);
        type_name._M_dataplus._M_p = (pointer)variables_primary;
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)variables_primary,&flags);
        type_name._M_dataplus._M_p._0_4_ = ts->id;
        pmVar12 = ::std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&(this->super_CompilerGLSL).super_Compiler.declared_block_names,
                               (key_type *)&type_name);
        ::std::__cxx11::string::_M_assign((string *)pmVar12);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::clear(&(type->member_name_cache)._M_h);
        CompilerGLSL::preserve_alias_on_reset(&this->super_CompilerGLSL,ts->id);
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,ts->id);
        to_resource_binding_abi_cxx11_(&type_name,this,var);
        CompilerGLSL::statement<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                  (&this->super_CompilerGLSL,(char (*) [9])"cbuffer ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags,
                   &type_name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)type_name._M_dataplus._M_p != &type_name.field_2) {
          operator_delete(type_name._M_dataplus._M_p);
        }
        CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
        sVar1 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                buffer_size;
        local_38 = ts;
        if (sVar1 != 0) {
          local_40 = (type->member_types).
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr;
          lVar18 = sVar1 << 2;
          uVar17 = 0;
          do {
            index = (uint32_t)uVar17;
            CompilerGLSL::add_member_name(&this->super_CompilerGLSL,type,index);
            psVar13 = Compiler::get_member_name_abi_cxx11_((Compiler *)this,(TypeID)__k->id,index);
            type_name._M_dataplus._M_p = (pointer)&type_name.field_2;
            pcVar2 = (psVar13->_M_dataplus)._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&type_name,pcVar2,pcVar2 + psVar13->_M_string_length);
            CompilerGLSL::to_member_name_abi_cxx11_
                      (&member_name,&this->super_CompilerGLSL,type,index);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      ((spirv_cross *)&failed_index,this,(ulong)local_38->id,1);
            join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                      (&local_c8,(spirv_cross *)&failed_index,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2beef5
                       ,(char (*) [2])&member_name,ts_2);
            ::std::__cxx11::string::operator=((string *)&member_name,(string *)&local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p);
            }
            if (_failed_index != local_50) {
              operator_delete(_failed_index);
            }
            ParsedIR::sanitize_underscores(&member_name);
            Compiler::set_member_name((Compiler *)this,(TypeID)__k->id,index,&member_name);
            uVar3 = local_40[uVar17].id;
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
            ts_2 = &local_c8;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x15])
                      (this,type,(ulong)uVar3,uVar17 & 0xffffffff,&local_c8,0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p);
            }
            Compiler::set_member_name((Compiler *)this,(TypeID)__k->id,index,&type_name);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)member_name._M_dataplus._M_p != &member_name.field_2) {
              operator_delete(member_name._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)type_name._M_dataplus._M_p != &type_name.field_2) {
              operator_delete(type_name._M_dataplus._M_p);
            }
            uVar17 = uVar17 + 1;
            lVar18 = lVar18 + -4;
          } while (lVar18 != 0);
        }
        CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
        CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2aec75);
        puVar16 = (undefined1 *)CONCAT44(flags.lower._4_4_,(uint32_t)flags.lower);
        if ((size_type *)puVar16 == &flags.higher._M_h._M_bucket_count) {
          return;
        }
      }
      else {
        if ((this->hlsl_options).shader_model < 0x33) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (this_00,
                     "Need ConstantBuffer<T> to use arrays of UBOs, but this is only supported in SM 5.1."
                    );
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(type->super_IVariant).self.id);
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,ts->id);
        _failed_index = (pointer)((ulong)uStack_5c << 0x20);
        bVar5 = CompilerGLSL::buffer_is_packing_standard
                          (&this->super_CompilerGLSL,type,BufferPackingHLSLCbuffer,&failed_index,0,
                           0xffffffff);
        if (!bVar5) {
          prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&type_name,this,(ulong)(type->super_IVariant).self.id,1);
          CompilerGLSL::to_member_name_abi_cxx11_
                    (&member_name,&this->super_CompilerGLSL,type,failed_index);
          join<char_const(&)[27],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[9],std::__cxx11::string,char_const(&)[17],unsigned_int&,char_const(&)[9],std::__cxx11::string,char_const(&)[54]>
                    ((string *)&flags,(spirv_cross *)"HLSL ConstantBuffer<T> ID ",(char (*) [27])ts,
                     (TypedID<(spirv_cross::Types)0> *)" (name: ",(char (*) [9])&type_name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "), member index ",(char (*) [17])&failed_index,(uint *)" (name: ",
                     (char (*) [9])&member_name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ") cannot be expressed with normal HLSL packing rules.",
                     (char (*) [54])type_name._M_dataplus._M_p);
          ::std::runtime_error::runtime_error(prVar14,(string *)&flags);
          *(undefined ***)prVar14 = &PTR__runtime_error_0035bd08;
          __cxa_throw(prVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        pSVar8 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            (type->super_IVariant).self.id);
        CompilerGLSL::emit_struct(&this->super_CompilerGLSL,pSVar8);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&flags,this,(ulong)(type->super_IVariant).self.id,1);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&type_name,this,(ulong)ts->id,1);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                  (&member_name,this,type,(ulong)ts->id);
        to_resource_binding_abi_cxx11_(&local_c8,this,var);
        CompilerGLSL::
        statement<char_const(&)[16],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [16])"ConstantBuffer<",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags,
                   (char (*) [3])0x2b9730,&type_name,&member_name,&local_c8,(char (*) [2])0x2d3bdb);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)member_name._M_dataplus._M_p != &member_name.field_2) {
          operator_delete(member_name._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)type_name._M_dataplus._M_p != &type_name.field_2) {
          operator_delete(type_name._M_dataplus._M_p);
        }
        puVar16 = (undefined1 *)CONCAT44(flags.lower._4_4_,(uint32_t)flags.lower);
        if ((size_type *)puVar16 == &flags.higher._M_h._M_bucket_count) {
          return;
        }
      }
      operator_delete(puVar16);
    }
    else {
      ParsedIR::get_buffer_block_flags(&flags,&(this->super_CompilerGLSL).super_Compiler.ir,var);
      if (((uint32_t)flags.lower >> 0x18 & 1) == 0) {
        bVar5 = false;
      }
      else {
        bVar5 = is_hlsl_force_storage_buffer_as_uav(this,(ID)ts->id);
        bVar5 = !bVar5;
      }
      uVar3 = (uint32_t)flags.lower >> 0x17;
      type_name._M_dataplus._M_p._0_4_ = ts->id;
      cVar7 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources._M_h,
                     (key_type *)&type_name);
      type_name._M_dataplus._M_p = (pointer)&type_name.field_2;
      type_name._M_string_length = 0;
      type_name.field_2._M_local_buf[0] = '\0';
      iVar6 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])(this);
      sVar4 = type_name._M_string_length;
      if ((char)iVar6 == '\0') {
        pcVar15 = "RasterizerOrderedByteAddressBuffer";
        if (cVar7.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          pcVar15 = "RWByteAddressBuffer";
        }
        __s = "ByteAddressBuffer";
        if (!bVar5) {
          __s = pcVar15;
        }
        strlen(__s);
        ::std::__cxx11::string::_M_replace((ulong)&type_name,0,(char *)sVar4,(ulong)__s);
      }
      else {
        pcVar15 = "RasterizerOrdered";
        if (cVar7.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          pcVar15 = "RW";
        }
        _failed_index = "";
        if (!bVar5) {
          _failed_index = pcVar15;
        }
        pSVar8 = type;
        if ((type->basetype == Struct) &&
           ((type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size == 1)) {
          pSVar8 = Variant::get<spirv_cross::SPIRType>
                             ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                              super_VectorView<spirv_cross::Variant>.ptr +
                              ((type->member_types).
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr)->
                              id);
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_c8,this,pSVar8,0);
        join<char_const*,char_const(&)[18],std::__cxx11::string,char_const(&)[2]>
                  (&member_name,(spirv_cross *)&failed_index,(char **)"StructuredBuffer<",
                   (char (*) [18])&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d188a,
                   (char (*) [2])in_R9);
        ::std::__cxx11::string::operator=((string *)&type_name,(string *)&member_name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)member_name._M_dataplus._M_p != &member_name.field_2) {
          operator_delete(member_name._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
      }
      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,ts->id);
      _failed_index_1 = "globallycoherent ";
      if (bVar5 || (uVar3 & 1) == 0) {
        _failed_index_1 = "";
      }
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (&member_name,this,(ulong)ts->id,1);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                (&local_c8,this,type,(ulong)ts->id);
      to_resource_binding_abi_cxx11_((string *)&failed_index,this,var);
      CompilerGLSL::
      statement<char_const*,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char **)&failed_index_1,&type_name,
                 (char (*) [2])0x2bb1d1,&member_name,&local_c8,(string *)&failed_index,
                 (char (*) [2])0x2d3bdb);
      if (_failed_index != local_50) {
        operator_delete(_failed_index);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)member_name._M_dataplus._M_p != &member_name.field_2) {
        operator_delete(member_name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)type_name._M_dataplus._M_p != &type_name.field_2) {
        operator_delete(type_name._M_dataplus._M_p);
      }
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&flags.higher._M_h);
    }
  }
  else {
    CompilerGLSL::emit_buffer_block_flattened(&this->super_CompilerGLSL,var);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_buffer_block(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);

	bool is_uav = var.storage == StorageClassStorageBuffer || has_decoration(type.self, DecorationBufferBlock);

	if (flattened_buffer_blocks.count(var.self))
	{
		emit_buffer_block_flattened(var);
	}
	else if (is_uav)
	{
		Bitset flags = ir.get_buffer_block_flags(var);
		bool is_readonly = flags.get(DecorationNonWritable) && !is_hlsl_force_storage_buffer_as_uav(var.self);
		bool is_coherent = flags.get(DecorationCoherent) && !is_readonly;
		bool is_interlocked = interlocked_resources.count(var.self) > 0;

		auto to_structuredbuffer_subtype_name = [this](const SPIRType &parent_type) -> std::string
		{
			if (parent_type.basetype == SPIRType::Struct && parent_type.member_types.size() == 1)
			{
				// Use type of first struct member as a StructuredBuffer will have only one '._m0' field in SPIR-V
				const auto &member0_type = this->get<SPIRType>(parent_type.member_types.front());
				return this->type_to_glsl(member0_type);
			}
			else
			{
				// Otherwise, this StructuredBuffer only has a basic subtype, e.g. StructuredBuffer<int>
				return this->type_to_glsl(parent_type);
			}
		};

		std::string type_name;
		if (is_user_type_structured(var.self))
			type_name = join(is_readonly ? "" : is_interlocked ? "RasterizerOrdered" : "RW", "StructuredBuffer<", to_structuredbuffer_subtype_name(type), ">");
		else
			type_name = is_readonly ? "ByteAddressBuffer" : is_interlocked ? "RasterizerOrderedByteAddressBuffer" : "RWByteAddressBuffer";

		add_resource_name(var.self);
		statement(is_coherent ? "globallycoherent " : "", type_name, " ", to_name(var.self), type_to_array_glsl(type, var.self),
		          to_resource_binding(var), ";");
	}
	else
	{
		if (type.array.empty())
		{
			// Flatten the top-level struct so we can use packoffset,
			// this restriction is similar to GLSL where layout(offset) is not possible on sub-structs.
			flattened_structs[var.self] = false;

			// Prefer the block name if possible.
			auto buffer_name = to_name(type.self, false);
			if (ir.meta[type.self].decoration.alias.empty() ||
			    resource_names.find(buffer_name) != end(resource_names) ||
			    block_names.find(buffer_name) != end(block_names))
			{
				buffer_name = get_block_fallback_name(var.self);
			}

			add_variable(block_names, resource_names, buffer_name);

			// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
			// This cannot conflict with anything else, so we're safe now.
			if (buffer_name.empty())
				buffer_name = join("_", get<SPIRType>(var.basetype).self, "_", var.self);

			uint32_t failed_index = 0;
			if (buffer_is_packing_standard(type, BufferPackingHLSLCbufferPackOffset, &failed_index))
				set_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset);
			else
			{
				SPIRV_CROSS_THROW(join("cbuffer ID ", var.self, " (name: ", buffer_name, "), member index ",
				                       failed_index, " (name: ", to_member_name(type, failed_index),
				                       ") cannot be expressed with either HLSL packing layout or packoffset."));
			}

			block_names.insert(buffer_name);

			// Save for post-reflection later.
			declared_block_names[var.self] = buffer_name;

			type.member_name_cache.clear();
			// var.self can be used as a backup name for the block name,
			// so we need to make sure we don't disturb the name here on a recompile.
			// It will need to be reset if we have to recompile.
			preserve_alias_on_reset(var.self);
			add_resource_name(var.self);
			statement("cbuffer ", buffer_name, to_resource_binding(var));
			begin_scope();

			uint32_t i = 0;
			for (auto &member : type.member_types)
			{
				add_member_name(type, i);
				auto backup_name = get_member_name(type.self, i);
				auto member_name = to_member_name(type, i);
				member_name = join(to_name(var.self), "_", member_name);
				ParsedIR::sanitize_underscores(member_name);
				set_member_name(type.self, i, member_name);
				emit_struct_member(type, member, i, "");
				set_member_name(type.self, i, backup_name);
				i++;
			}

			end_scope_decl();
			statement("");
		}
		else
		{
			if (hlsl_options.shader_model < 51)
				SPIRV_CROSS_THROW(
				    "Need ConstantBuffer<T> to use arrays of UBOs, but this is only supported in SM 5.1.");

			add_resource_name(type.self);
			add_resource_name(var.self);

			// ConstantBuffer<T> does not support packoffset, so it is unuseable unless everything aligns as we expect.
			uint32_t failed_index = 0;
			if (!buffer_is_packing_standard(type, BufferPackingHLSLCbuffer, &failed_index))
			{
				SPIRV_CROSS_THROW(join("HLSL ConstantBuffer<T> ID ", var.self, " (name: ", to_name(type.self),
				                       "), member index ", failed_index, " (name: ", to_member_name(type, failed_index),
				                       ") cannot be expressed with normal HLSL packing rules."));
			}

			emit_struct(get<SPIRType>(type.self));
			statement("ConstantBuffer<", to_name(type.self), "> ", to_name(var.self), type_to_array_glsl(type, var.self),
			          to_resource_binding(var), ";");
		}
	}
}